

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

Vec4 __thiscall
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::getSamplePos
          (ImageSampleInstanceImages *this,VkImageViewType viewType,deUint32 baseMipLevel,
          deUint32 baseArraySlice,int samplePosNdx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong in_XMM1_Qa;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  ulong uVar16;
  Vec4 VVar17;
  uint local_48 [2];
  deUint32 slices [4];
  float local_30 [4];
  float local_20;
  float local_1c;
  float fStack_18;
  float fStack_14;
  undefined8 uStack_10;
  
  uVar7 = 0x40 >> ((byte)baseMipLevel & 0x1f);
  uVar5 = 1;
  if ((viewType & ~VK_IMAGE_VIEW_TYPE_2D) == VK_IMAGE_VIEW_TYPE_1D_ARRAY) {
    uVar5 = 2 - baseArraySlice;
  }
  if (viewType == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) {
    uVar5 = 2 - baseArraySlice;
  }
  uVar6 = (ulong)uVar5;
  if (VK_IMAGE_VIEW_TYPE_CUBE_ARRAY < viewType) {
    (this->super_ImageInstanceImages).m_viewType = VK_IMAGE_VIEW_TYPE_1D;
    (this->super_ImageInstanceImages).m_baseMipLevel = 0;
    (this->super_ImageInstanceImages).m_baseArraySlice = 0;
    (this->super_ImageInstanceImages).m_imageFormat.order = R;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = in_XMM1_Qa;
    return (float  [4])(auVar13 << 0x40);
  }
  if ((0x37U >> (viewType & 0x1f) & 1) == 0) {
    auVar9._12_4_ = (float)(int)uVar7;
    slices[2] = 0x3f400000;
    slices[3] = 0x3f000000;
    local_30[0] = auVar9._12_4_;
    local_30[1] = (float)(uVar7 + 0xf & 0xd) + 0.25;
    uVar8 = uVar7 + 0x7f;
    local_30[2] = 0.0;
    local_30[3] = (float)(uVar7 - 1 & 0x10) + 0.5;
    local_20 = 0.0;
    local_1c = (float)(uVar8 & 0x54) + 0.5;
    fStack_18 = (float)(uVar7 + 0xf & 10) + 0.75;
    fStack_14 = auVar9._12_4_;
    uStack_10 = CONCAT44((float)(uVar8 & 0x53) + 0.75,(float)(uVar8 & 0x4b) + 0.25);
    local_48[0] = (uint)(uVar5 != 1);
    local_48[1] = (int)(2 % (ulong)uVar5);
    slices[0] = (deUint32)(9 % uVar6);
    slices[1] = (deUint32)(5 % (ulong)uVar5);
    lVar4 = (long)samplePosNdx;
    uVar5 = local_48[lVar4];
    fVar15 = local_30[lVar4 * 3] / auVar9._12_4_ + local_30[lVar4 * 3] / auVar9._12_4_ + -1.0;
    uVar16 = (ulong)(uint)fVar15;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = *(ulong *)(slices + lVar4 * 3 + 2);
    auVar2._4_4_ = auVar9._12_4_;
    auVar2._0_4_ = auVar9._12_4_;
    auVar2._8_4_ = auVar9._12_4_;
    auVar2._12_4_ = auVar9._12_4_;
    auVar13 = divps(auVar14,auVar2);
    (this->super_ImageInstanceImages).m_viewType =
         (VkImageViewType)(auVar13._0_4_ + auVar13._0_4_ + -1.0);
    (this->super_ImageInstanceImages).m_baseMipLevel =
         (deUint32)(auVar13._4_4_ + auVar13._4_4_ + -1.0);
    (this->super_ImageInstanceImages).m_baseArraySlice = (deUint32)fVar15;
    (this->super_ImageInstanceImages).m_imageFormat.order = (ChannelOrder)(float)uVar5;
    goto LAB_00511401;
  }
  slices[2] = 0x3f400000;
  slices[3] = 0x3f000000;
  uVar5 = uVar7 + 0x7f;
  uVar16 = CONCAT44(uVar7 + 0x1f,uVar7 - 1) & 0x170000000c;
  auVar9._0_4_ = (float)(int)uVar16;
  auVar9._4_4_ = (float)(int)(uVar16 >> 0x20);
  auVar9._8_4_ = (float)(uVar5 & 0x49);
  auVar9._12_4_ = (float)(int)uVar7;
  local_30[0] = auVar9._0_4_ + 0.25;
  local_30[1] = auVar9._4_4_ + 0.25;
  local_30[2] = auVar9._8_4_ + 0.5;
  local_30[3] = (float)(uVar7 + 0x1f & 0x10) + 0.5 + auVar9._12_4_;
  fVar15 = (float)(uVar5 & 0x54) + 0.5;
  local_20 = 0.25 - (float)(uVar7 - 1 & 0x2b);
  auVar3._4_8_ = auVar9._8_8_;
  auVar3._0_4_ = 0x3f400000;
  auVar10._0_8_ = auVar3._0_8_ << 0x20;
  auVar10._8_4_ = 0x3f000000;
  auVar10._12_4_ = 0x3e800000;
  auVar11._4_12_ = auVar10._4_12_;
  auVar11._0_4_ = fVar15;
  uVar16 = auVar11._0_8_;
  local_1c = auVar9._12_4_ + fVar15;
  fStack_18 = (float)(uVar5 & 0x75) + 0.75;
  fStack_14 = auVar9._12_4_ + 0.5;
  uStack_10 = CONCAT44((float)(uVar5 & 0x53) + 0.25 + auVar9._12_4_,(float)(uVar5 & 0x4b) + 0.25);
  local_48[0] = 0;
  local_48[1] = (int)(4 % uVar6);
  slices[0] = (deUint32)(9 % uVar6);
  slices[1] = (deUint32)(2 % uVar6);
  if ((viewType & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY) == VK_IMAGE_VIEW_TYPE_2D) {
    fVar15 = (float)local_48[samplePosNdx];
    uVar6 = *(ulong *)(slices + (long)samplePosNdx * 3 + 2);
  }
  else {
    if ((viewType & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY) == VK_IMAGE_VIEW_TYPE_1D) {
      uVar5 = local_48[samplePosNdx];
      uVar16 = (ulong)(uint)((float)slices[(long)samplePosNdx * 3 + 2] / auVar9._12_4_);
      (this->super_ImageInstanceImages).m_viewType =
           (VkImageViewType)((float)slices[(long)samplePosNdx * 3 + 2] / auVar9._12_4_);
      (this->super_ImageInstanceImages).m_baseMipLevel = (deUint32)(float)uVar5;
      (this->super_ImageInstanceImages).m_baseArraySlice = 0;
      (this->super_ImageInstanceImages).m_imageFormat.order = R;
      goto LAB_00511401;
    }
    if (viewType != VK_IMAGE_VIEW_TYPE_3D) {
      auVar9._12_4_ = 0.0;
      (this->super_ImageInstanceImages).m_viewType = VK_IMAGE_VIEW_TYPE_1D;
      (this->super_ImageInstanceImages).m_baseMipLevel = 0;
      (this->super_ImageInstanceImages).m_baseArraySlice = 0;
      (this->super_ImageInstanceImages).m_imageFormat.order = R;
      goto LAB_00511401;
    }
    fVar15 = local_30[(long)samplePosNdx * 3] / auVar9._12_4_;
    uVar6 = *(ulong *)(slices + (long)samplePosNdx * 3 + 2);
  }
  uVar16 = (ulong)(uint)fVar15;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar6;
  auVar1._4_4_ = auVar9._12_4_;
  auVar1._0_4_ = auVar9._12_4_;
  auVar1._8_4_ = auVar9._12_4_;
  auVar1._12_4_ = auVar9._12_4_;
  auVar13 = divps(auVar12,auVar1);
  (this->super_ImageInstanceImages).m_viewType = (int)auVar13._0_8_;
  (this->super_ImageInstanceImages).m_baseMipLevel = (int)((ulong)auVar13._0_8_ >> 0x20);
  (this->super_ImageInstanceImages).m_baseArraySlice = (deUint32)fVar15;
  (this->super_ImageInstanceImages).m_imageFormat.order = R;
LAB_00511401:
  VVar17.m_data[1] = auVar9._12_4_;
  VVar17.m_data[0] = auVar9._12_4_;
  VVar17.m_data[2] = (float)(int)uVar16;
  VVar17.m_data[3] = (float)(int)(uVar16 >> 0x20);
  return (Vec4)VVar17.m_data;
}

Assistant:

tcu::Vec4 ImageSampleInstanceImages::getSamplePos (vk::VkImageViewType viewType, deUint32 baseMipLevel, deUint32 baseArraySlice, int samplePosNdx)
{
	DE_ASSERT(de::inBounds(samplePosNdx, 0, 4));

	const deUint32	imageSize	= (deUint32)IMAGE_SIZE >> baseMipLevel;
	const deUint32	arraySize	= isImageViewTypeArray(viewType) ? ARRAY_SIZE - baseArraySlice : 1;

	// choose arbitrary values that are not ambiguous with NEAREST filtering

	switch (viewType)
	{
		case vk::VK_IMAGE_VIEW_TYPE_1D:
		case vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY:
		case vk::VK_IMAGE_VIEW_TYPE_2D:
		case vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY:
		case vk::VK_IMAGE_VIEW_TYPE_3D:
		{
			const tcu::Vec3	coords[4]	=
			{
				tcu::Vec3(0.75f,
						  0.5f,
						  (float)(12u % imageSize) + 0.25f),

				tcu::Vec3((float)(23u % imageSize) + 0.25f,
						  (float)(73u % imageSize) + 0.5f,
						  (float)(16u % imageSize) + 0.5f + (float)imageSize),

				tcu::Vec3(-(float)(43u % imageSize) + 0.25f,
						  (float)(84u % imageSize) + 0.5f + (float)imageSize,
						  (float)(117u % imageSize) + 0.75f),

				tcu::Vec3((float)imageSize + 0.5f,
						  (float)(75u % imageSize) + 0.25f,
						  (float)(83u % imageSize) + 0.25f + (float)imageSize),
			};
			const deUint32	slices[4]	=
			{
				0u % arraySize,
				4u % arraySize,
				9u % arraySize,
				2u % arraySize,
			};

			if (viewType == vk::VK_IMAGE_VIEW_TYPE_1D || viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 (float)slices[samplePosNdx],
								 0.0f,
								 0.0f);
			else if (viewType == vk::VK_IMAGE_VIEW_TYPE_2D || viewType == vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 coords[samplePosNdx].y() / (float)imageSize,
								 (float)slices[samplePosNdx],
								 0.0f);
			else if (viewType == vk::VK_IMAGE_VIEW_TYPE_3D)
				return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize,
								 coords[samplePosNdx].y() / (float)imageSize,
								 coords[samplePosNdx].z() / (float)imageSize,
								 0.0f);
			else
			{
				DE_FATAL("Impossible");
				return tcu::Vec4();
			}
		}

		case vk::VK_IMAGE_VIEW_TYPE_CUBE:
		case vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
		{
			// \note these values are in [0, texSize]*3 space for convenience
			const tcu::Vec3	coords[4]	=
			{
				tcu::Vec3(0.75f,
						  0.5f,
						  (float)imageSize),

				tcu::Vec3((float)(13u % imageSize) + 0.25f,
						  0.0f,
						  (float)(16u % imageSize) + 0.5f),

				tcu::Vec3(0.0f,
						  (float)(84u % imageSize) + 0.5f,
						  (float)(10u % imageSize) + 0.75f),

				tcu::Vec3((float)imageSize,
						  (float)(75u % imageSize) + 0.25f,
						  (float)(83u % imageSize) + 0.75f),
			};
			const deUint32	slices[4]	=
			{
				1u % arraySize,
				2u % arraySize,
				9u % arraySize,
				5u % arraySize,
			};

			DE_ASSERT(de::inRange(coords[samplePosNdx].x(), 0.0f, (float)imageSize));
			DE_ASSERT(de::inRange(coords[samplePosNdx].y(), 0.0f, (float)imageSize));
			DE_ASSERT(de::inRange(coords[samplePosNdx].z(), 0.0f, (float)imageSize));

			// map to [-1, 1]*3 space
			return tcu::Vec4(coords[samplePosNdx].x() / (float)imageSize * 2.0f - 1.0f,
							 coords[samplePosNdx].y() / (float)imageSize * 2.0f - 1.0f,
							 coords[samplePosNdx].z() / (float)imageSize * 2.0f - 1.0f,
							 (float)slices[samplePosNdx]);
		}

		default:
			DE_FATAL("Impossible");
			return tcu::Vec4();
	}
}